

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

int __thiscall QMetaObject::indexOfSlot(QMetaObject *this,char *slot)

{
  QByteArrayView name_00;
  int iVar1;
  QArgumentType *pQVar2;
  long in_FS_OFFSET;
  int i;
  QByteArrayView name;
  QMetaObject *m;
  QArgumentTypeArray types;
  QArgumentType *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  QVarLengthArray<QArgumentType,_10LL> *this_00;
  QArgumentTypeArray *in_stack_fffffffffffffe30;
  QVarLengthArray<QArgumentType,_10LL> *this_01;
  int local_19c;
  QVarLengthArray<QArgumentType,_10LL> local_160;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = &local_160;
  memset(this_01,0xaa,0x158);
  QVarLengthArray<QArgumentType,_10LL>::QVarLengthArray(this_01);
  QMetaObjectPrivate::decodeMethodSignature((char *)this_01,in_stack_fffffffffffffe30);
  this_00 = &local_160;
  QVLABaseBase::size((QVLABaseBase *)this_00);
  pQVar2 = QVarLengthArray<QArgumentType,_10LL>::constData
                     ((QVarLengthArray<QArgumentType,_10LL> *)0x35ef02);
  name_00.m_data = (storage_type *)this_01;
  name_00.m_size = (qsizetype)pQVar2;
  local_19c = QMetaObjectPrivate::indexOfSlotRelative
                        ((QMetaObject **)
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),name_00,
                         in_stack_fffffffffffffe14,in_stack_fffffffffffffe08);
  if (-1 < local_19c) {
    iVar1 = methodOffset((QMetaObject *)
                         CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    local_19c = iVar1 + local_19c;
  }
  QVarLengthArray<QArgumentType,_10LL>::~QVarLengthArray(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_19c;
  }
  __stack_chk_fail();
}

Assistant:

int QMetaObject::indexOfSlot(const char *slot) const
{
    const QMetaObject *m = this;
    int i;
    Q_ASSERT(priv(m->d.data)->revision >= 7);
    QArgumentTypeArray types;
    QByteArrayView name = QMetaObjectPrivate::decodeMethodSignature(slot, types);
    i = QMetaObjectPrivate::indexOfSlotRelative(&m, name, types.size(), types.constData());
    if (i >= 0)
        i += m->methodOffset();
    return i;
}